

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  ulong unaff_RBP;
  char *pcVar7;
  ulong n;
  size_t sVar8;
  char *pcVar9;
  size_t lp;
  size_t ls;
  MatchState ms;
  ulong local_288;
  int local_27c;
  char *local_278;
  char *local_270;
  ulong local_268;
  MatchState local_260;
  
  local_27c = find;
  local_278 = luaL_checklstring(L,1,&local_268);
  pcVar4 = luaL_checklstring(L,2,&local_288);
  uVar5 = luaL_optinteger(L,3,1);
  if ((long)uVar5 < 0) {
    if (local_268 < -uVar5) {
      uVar5 = 0;
    }
    else {
      uVar5 = uVar5 + local_268 + 1;
    }
  }
  n = 1;
  if ((uVar5 == 0) || (n = uVar5, uVar5 <= local_268 + 1)) {
    local_270 = pcVar4;
    if (local_27c == 0) {
LAB_00119f24:
      pcVar4 = local_278;
      cVar1 = *local_270;
      pcVar7 = local_270;
      if (cVar1 == '^') {
        pcVar7 = local_270 + 1;
        local_288 = local_288 - 1;
      }
      local_260.matchdepth = 200;
      local_260.src_init = local_278;
      local_260.src_end = local_278 + local_268;
      local_260.p_end = pcVar7 + local_288;
      local_260.L = L;
      do {
        pcVar6 = pcVar4 + (n - 1);
        local_260.level = 0;
        pcVar9 = match(&local_260,pcVar6,pcVar7);
        if (pcVar9 != (char *)0x0) {
          if (local_27c == 0) {
            uVar3 = push_captures(&local_260,pcVar6,pcVar9);
            unaff_RBP = (ulong)uVar3;
          }
          else {
            lua_pushinteger(L,n);
            lua_pushinteger(L,(long)pcVar9 - (long)local_278);
            iVar2 = push_captures(&local_260,(char *)0x0,(char *)0x0);
            unaff_RBP = (ulong)(iVar2 + 2);
          }
        }
        if (pcVar9 != (char *)0x0) {
          return (int)unaff_RBP;
        }
      } while ((cVar1 != '^') && (n = n + 1, pcVar6 < local_260.src_end));
    }
    else {
      iVar2 = lua_toboolean(L,4);
      uVar5 = local_288;
      if (iVar2 == 0) {
        unaff_RBP = 0;
        do {
          pcVar4 = local_270 + unaff_RBP;
          pcVar7 = strpbrk(pcVar4,"^$*+?.([%-");
          if (pcVar7 != (char *)0x0) goto LAB_00119f24;
          sVar8 = strlen(pcVar4);
          unaff_RBP = unaff_RBP + sVar8 + 1;
        } while (unaff_RBP <= uVar5);
      }
      pcVar4 = local_278 + (n - 1);
      if (local_288 != 0) {
        uVar5 = (local_268 - n) + 1;
        if (local_288 <= uVar5) {
          sVar8 = local_288 - 1;
          pcVar7 = (char *)(uVar5 - sVar8);
          if (pcVar7 != (char *)0x0) {
            cVar1 = *local_270;
            pcVar9 = local_270 + 1;
            pcVar6 = pcVar4;
            do {
              pcVar4 = (char *)memchr(pcVar6,(int)cVar1,(size_t)pcVar7);
              if (pcVar4 == (char *)0x0) break;
              __s1 = pcVar4 + 1;
              iVar2 = bcmp(__s1,pcVar9,sVar8);
              if (iVar2 == 0) goto LAB_00119ea5;
              pcVar7 = pcVar6 + ((long)pcVar7 - (long)__s1);
              pcVar6 = __s1;
            } while (pcVar7 != (char *)0x0);
          }
        }
        pcVar4 = (char *)0x0;
      }
LAB_00119ea5:
      pcVar7 = local_278;
      if (pcVar4 != (char *)0x0) {
        lua_pushinteger(L,(lua_Integer)(pcVar4 + (1 - (long)local_278)));
        lua_pushinteger(L,(lua_Integer)(pcVar4 + (local_288 - (long)pcVar7)));
        return 2;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelat(luaL_optinteger(L, 3, 1), ls);
  if (init < 1) init = 1;
  else if (init > ls + 1) {  /* start after string's end? */
    lua_pushnil(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init - 1, ls - init + 1, p, lp);
    if (s2) {
      lua_pushinteger(L, s2 - s + 1);
      lua_pushinteger(L, s2 - s + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init - 1;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    ms.L = L;
    ms.matchdepth = MAXCCALLS;
    ms.src_init = s;
    ms.src_end = s + ls;
    ms.p_end = p + lp;
    do {
      const char *res;
      ms.level = 0;
      lua_assert(ms.matchdepth == MAXCCALLS);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1 - s + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}